

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtPrintBinary(word *pTruth,int nVars)

{
  word *pwVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar4 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    iVar4 = 1;
  }
  if (nVars < 2) {
    __assert_fail("nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x552,"void Abc_TtPrintBinary(word *, int)");
  }
  pwVar1 = pTruth + iVar4;
  bVar2 = (byte)nVars & 0x1f;
  uVar3 = 1 << bVar2;
  uVar5 = 0x40;
  if ((int)uVar3 < 0x40) {
    uVar5 = uVar3;
  }
  if ((int)uVar5 < 1) {
    uVar5 = 0 << bVar2;
  }
  for (; pTruth < pwVar1; pTruth = pTruth + 1) {
    uVar6 = 0;
    while (uVar3 = (uint)uVar6, uVar5 != uVar3) {
      printf("%d",(ulong)((*(uint *)((long)pTruth + (uVar6 >> 5) * 4) >> (uVar3 & 0x1f) & 1) != 0));
      uVar6 = (ulong)(uVar3 + 1);
    }
  }
  putchar(10);
  return;
}

Assistant:

static inline void Abc_TtPrintBinary( word * pTruth, int nVars )
{
    word * pThis, * pLimit = pTruth + Abc_TtWordNum(nVars);
    int k, Limit = Abc_MinInt( 64, (1 << nVars) );
    assert( nVars >= 2 );
    for ( pThis = pTruth; pThis < pLimit; pThis++ )
        for ( k = 0; k < Limit; k++ )
            printf( "%d", Abc_InfoHasBit( (unsigned *)pThis, k ) );
    printf( "\n" );
}